

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void baryonyx::itm::
     random_epsilon_unique<long_double,__gnu_cxx::__normal_iterator<std::pair<long_double,int>*,std::vector<std::pair<long_double,int>,std::allocator<std::pair<long_double,int>>>>>
               (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                begin,__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      end,random_engine *rng,longdouble min,longdouble max)

{
  bool bVar1;
  pointer ppVar2;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__urng;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  undefined1 local_68 [8];
  uniform_real_distribution<long_double> distribution;
  longdouble max_local;
  longdouble min_local;
  random_engine *rng_local;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  end_local;
  __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
  begin_local;
  
  stack0xffffffffffffffb8 = max;
  rng_local = (random_engine *)end._M_current;
  end_local = begin;
  if (min == max) {
    details::fail_fast("Precondition","min != max",
                       "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                       ,"954");
  }
  lVar3 = in_ST5;
  lVar4 = in_ST5;
  std::uniform_real_distribution<long_double>::uniform_real_distribution
            ((uniform_real_distribution<long_double> *)local_68,min,max);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                      (&end_local,
                       (__normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
                        *)&rng_local);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::uniform_real_distribution<long_double>::operator()
              ((result_type_conflict5 *)local_68,(uniform_real_distribution<long_double> *)rng,
               __urng);
    ppVar2 = __gnu_cxx::
             __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
             ::operator->(&end_local);
    ppVar2->first = in_ST0;
    lVar5 = lVar4;
    __gnu_cxx::
    __normal_iterator<std::pair<long_double,_int>_*,_std::vector<std::pair<long_double,_int>,_std::allocator<std::pair<long_double,_int>_>_>_>
    ::operator++(&end_local);
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = lVar3;
    lVar3 = lVar4;
    lVar4 = lVar5;
  }
  return;
}

Assistant:

inline void
random_epsilon_unique(iteratorT begin,
                      iteratorT end,
                      random_engine& rng,
                      floatingpointT min,
                      floatingpointT max)
{
    bx_expects(min != max);

    std::uniform_real_distribution<floatingpointT> distribution(min, max);

    for (; begin != end; ++begin)
        begin->first = distribution(rng);
}